

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.h
# Opt level: O2

void __thiscall
slang::ast::ConfigBlockSymbol::ConfigBlockSymbol
          (ConfigBlockSymbol *this,Compilation *compilation,string_view name,SourceLocation loc)

{
  (this->super_Symbol).kind = ConfigBlock;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->isUsed = false;
  (this->topCells)._M_ptr = (pointer)0x0;
  (this->topCells)._M_extent._M_extent_value = 0;
  (this->defaultLiblist)._M_ptr = (pointer)0x0;
  (this->defaultLiblist)._M_extent._M_extent_value = 0;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
  ::unordered_flat_map(&this->cellOverrides);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  ::unordered_flat_map(&this->instanceOverrides);
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
  ::unordered_flat_map(&this->ruleBySyntax);
  this->resolved = false;
  return;
}

Assistant:

ConfigBlockSymbol(Compilation& compilation, std::string_view name, SourceLocation loc) :
        Symbol(SymbolKind::ConfigBlock, name, loc), Scope(compilation, this) {}